

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bread.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  char *pcVar1;
  char *pcVar2;
  size_type sVar3;
  size_type sVar4;
  int iVar5;
  undefined4 extraout_var;
  ostream *poVar6;
  string *input;
  string inputPath;
  string dateFormat;
  string format;
  ifstream inputFile;
  long *local_2a0;
  char *local_298;
  long local_290 [2];
  ulong local_280;
  string local_278;
  string local_258;
  string local_238 [520];
  
  local_2a0 = local_290;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2a0,"-","");
  local_258._M_dataplus._M_p = (pointer)&local_258.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_258,"%S %C [%d] %n %m (%G:%L)\n","");
  local_278._M_dataplus._M_p = (pointer)&local_278.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_278,"%Y-%m-%d %H:%M:%S.%N","");
  local_280 = 0;
LAB_001025ca:
  do {
    while( true ) {
      iVar5 = getopt(argc,argv,"f:d:sh");
      sVar4 = local_258._M_string_length;
      sVar3 = local_278._M_string_length;
      pcVar2 = local_298;
      pcVar1 = _optarg;
      if (0x65 < iVar5) break;
      if (iVar5 != 100) {
        if (iVar5 == -1) {
          if (_optind < argc) {
            pcVar1 = argv[_optind];
            strlen(pcVar1);
            std::__cxx11::string::_M_replace((ulong)&local_2a0,0,pcVar2,(ulong)pcVar1);
          }
          input = local_238;
          std::ifstream::ifstream(input);
          iVar5 = std::__cxx11::string::compare((char *)&local_2a0);
          if (iVar5 == 0) {
            input = (string *)&std::cin;
          }
          else {
            std::ifstream::open(input,(_Ios_Openmode)&local_2a0);
          }
          if (((byte)((istream *)input)[*(long *)(*(long *)input + -0x18) + 0x20] & 5) == 0) {
            std::ios_base::sync_with_stdio(false);
            if ((local_280 & 1) == 0) {
              printEvents((istream *)input,(ostream *)&std::cout,&local_258,&local_278);
            }
            else {
              printSortedEvents((istream *)input,(ostream *)&std::cout,&local_258,&local_278);
            }
            iVar5 = 0;
          }
          else {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cerr,"[bread] Failed to open \'",0x18);
            poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                               ((ostream *)&std::cerr,(char *)local_2a0,(long)local_298);
            iVar5 = 2;
            std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\' for reading\n",0xe);
          }
          std::ifstream::~ifstream(local_238);
        }
        else {
LAB_00102704:
          iVar5 = 1;
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,
                     "bread -- convert binary logfiles to human readable text\n\nSynopsis:\n  bread [-f format] [-d date-format] [-s] filename\n\nExamples:\n  bread logfile.blog\n  bread -f \'%S %m (%G:%L)\' logfile.blog\n  zcat logfile.blog.gz | bread -f \'%S %m (%G:%L)\' -\n  tail -c +0 -F logfile.blog | bread\n\nArguments:\n  filename       Path to a logfile. If \'-\' or unspecified, read from stdin\n  format         Arbitrary string with optional placeholders, see \'Event Format\'\n  date-format    Arbitrary string with optional placeholders, see \'Date Format\'\n\nAllowed options:\n  -h             Show this help\n  -f             Set a custom format string to write events, see \'Event Format\'\n  -d             Set a custom format string to write timestamps, see \'Date Format\'\n  -s             Sort events by time\n\nEvent Format\n  Log events are transformed to text by substituting placeholders of the format string by event fields. Available placeholders:\n\n  %I \t Source id\n  %S \t Severity\n  %C \t Category\n  %M \t Function\n  %F \t File, full path\n  %G \t File, file name only\n  %L \t Line\n  %P \t Format string\n  %T \t Argument tags\n  %n \t Writer (thread) name\n  %t \t Writer (thread) id\n  %d \t Timestamp, in producer timezone\n  %u \t Timestamp, in UTC\n  %r \t Timestamp, raw clock value\n  %m \t Message (format string with arguments substituted)\n  %% \t Literal %\n\n  Default format string: \"%S %C [%d] %n %m (%G:%L)\"\n\nDate Format\n  Timestamps are transformed to text by substituting placeholders of the date format string by date components. Available placeholders:\n\n  %Y \t Year, four digits\n  %y \t Year, two digits\n  %m \t Month (01-12)\n  %d \t Day (01-31)\n  %H \t Hour (00-23)\n  %M \t Minute (00-59)\n  %S \t Second (00-59)\n  %N \t Nanosecond (0-999999999)\n  %z \t Offset from UTC in ISO 8601 format (e.g: +0430)\n  %Z \t Time zone name abbreviation\n\n  Default date format string: \"%Y-%m-%d %H:%M:%S.%N\"\n\nReport bugs to:\n  https://github.com/erenon/binlog/issues\n"
                     ,0x774);
        }
LAB_001027d2:
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_278._M_dataplus._M_p != &local_278.field_2) {
          operator_delete(local_278._M_dataplus._M_p,local_278.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_258._M_dataplus._M_p != &local_258.field_2) {
          operator_delete(local_258._M_dataplus._M_p,local_258.field_2._M_allocated_capacity + 1);
        }
        if (local_2a0 != local_290) {
          operator_delete(local_2a0,local_290[0] + 1);
        }
        return iVar5;
      }
      strlen(_optarg);
      std::__cxx11::string::_M_replace((ulong)&local_278,0,(char *)sVar3,(ulong)pcVar1);
    }
    if (iVar5 == 0x66) {
      strlen(_optarg);
      std::__cxx11::string::_M_replace((ulong)&local_258,0,(char *)sVar4,(ulong)pcVar1);
      std::__cxx11::string::append((char *)&local_258);
      goto LAB_001025ca;
    }
    if (iVar5 == 0x68) {
      iVar5 = 0;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,
                 "bread -- convert binary logfiles to human readable text\n\nSynopsis:\n  bread [-f format] [-d date-format] [-s] filename\n\nExamples:\n  bread logfile.blog\n  bread -f \'%S %m (%G:%L)\' logfile.blog\n  zcat logfile.blog.gz | bread -f \'%S %m (%G:%L)\' -\n  tail -c +0 -F logfile.blog | bread\n\nArguments:\n  filename       Path to a logfile. If \'-\' or unspecified, read from stdin\n  format         Arbitrary string with optional placeholders, see \'Event Format\'\n  date-format    Arbitrary string with optional placeholders, see \'Date Format\'\n\nAllowed options:\n  -h             Show this help\n  -f             Set a custom format string to write events, see \'Event Format\'\n  -d             Set a custom format string to write timestamps, see \'Date Format\'\n  -s             Sort events by time\n\nEvent Format\n  Log events are transformed to text by substituting placeholders of the format string by event fields. Available placeholders:\n\n  %I \t Source id\n  %S \t Severity\n  %C \t Category\n  %M \t Function\n  %F \t File, full path\n  %G \t File, file name only\n  %L \t Line\n  %P \t Format string\n  %T \t Argument tags\n  %n \t Writer (thread) name\n  %t \t Writer (thread) id\n  %d \t Timestamp, in producer timezone\n  %u \t Timestamp, in UTC\n  %r \t Timestamp, raw clock value\n  %m \t Message (format string with arguments substituted)\n  %% \t Literal %\n\n  Default format string: \"%S %C [%d] %n %m (%G:%L)\"\n\nDate Format\n  Timestamps are transformed to text by substituting placeholders of the date format string by date components. Available placeholders:\n\n  %Y \t Year, four digits\n  %y \t Year, two digits\n  %m \t Month (01-12)\n  %d \t Day (01-31)\n  %H \t Hour (00-23)\n  %M \t Minute (00-59)\n  %S \t Second (00-59)\n  %N \t Nanosecond (0-999999999)\n  %z \t Offset from UTC in ISO 8601 format (e.g: +0430)\n  %Z \t Time zone name abbreviation\n\n  Default date format string: \"%Y-%m-%d %H:%M:%S.%N\"\n\nReport bugs to:\n  https://github.com/erenon/binlog/issues\n"
                 ,0x774);
      goto LAB_001027d2;
    }
    if (iVar5 != 0x73) goto LAB_00102704;
    local_280 = CONCAT71((int7)(CONCAT44(extraout_var,iVar5) >> 8),1);
  } while( true );
}

Assistant:

int main(int argc, /*const*/ char* argv[])
{
  std::string inputPath = "-";
  std::string format = BINLOG_DEFAULT_FORMAT "\n";
  std::string dateFormat = BINLOG_DEFAULT_DATE_FORMAT;
  bool sorted = false;

  int opt;
  while ((opt = getopt(argc, argv, "f:d:sh")) != -1) // NOLINT(concurrency-mt-unsafe)
  {
    switch (opt)
    {
    case 'f':
      format = optarg;
      format += "\n";
      break;
    case 'd':
      dateFormat = optarg;
      break;
    case 's':
      sorted = true;
      break;
    case 'h':
      showHelp();
      return 0;
    default:
      // getopt prints a useful error message by default (opterr is set)
      showHelp();
      return 1;
    }
  }

  if (optind < argc)
  {
    inputPath = argv[optind];
  }

  std::ifstream inputFile;
  std::istream& input = openFile(inputPath, inputFile);
  if (! input)
  {
    std::cerr << "[bread] Failed to open '" << inputPath << "' for reading\n";
    return 2;
  }

  std::ostream::sync_with_stdio(false);

  try
  {
    if (sorted)
    {
      printSortedEvents(input, std::cout, format, dateFormat);
    }
    else
    {
      printEvents(input, std::cout, format, dateFormat);
    }
  }
  catch (const std::exception& ex)
  {
    std::cerr << "[bread] Exception: " << ex.what() << "\n";
    return 3;
  }

  return 0;
}